

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

DThinker * __thiscall
FDecalStretcherAnim::CreateThinker(FDecalStretcherAnim *this,DBaseDecal *actor,side_t *wall)

{
  bool bVar1;
  DDecalStretcher *this_00;
  int iVar2;
  double dVar3;
  
  this_00 = (DDecalStretcher *)DObject::operator_new(0x70);
  DDecalStretcher::DDecalStretcher(this_00,actor);
  iVar2 = *(int *)&(this->super_FDecalAnimator).field_0xc + level.maptime;
  this_00->TimeToStart = iVar2;
  this_00->TimeToStop = iVar2 + this->StretchTime;
  dVar3 = this->GoalX;
  bVar1 = 0.0 <= dVar3;
  if (!bVar1) {
    dVar3 = 0.0;
  }
  this_00->GoalX = dVar3;
  this_00->bStretchX = bVar1;
  dVar3 = this->GoalY;
  bVar1 = 0.0 <= dVar3;
  if (!bVar1) {
    dVar3 = 0.0;
  }
  this_00->GoalY = dVar3;
  this_00->bStretchY = bVar1;
  this_00->bStarted = false;
  return (DThinker *)this_00;
}

Assistant:

DThinker *FDecalStretcherAnim::CreateThinker (DBaseDecal *actor, side_t *wall) const
{
	DDecalStretcher *thinker = new DDecalStretcher (actor);

	thinker->TimeToStart = level.maptime + StretchStart;
	thinker->TimeToStop = thinker->TimeToStart + StretchTime;

	if (GoalX >= 0)
	{
		thinker->GoalX = GoalX;
		thinker->bStretchX = true;
	}
	else
	{
		thinker->GoalX = 0;
		thinker->bStretchX = false;
	}
	if (GoalY >= 0)
	{
		thinker->GoalY = GoalY;
		thinker->bStretchY = true;
	}
	else
	{
		thinker->GoalY = 0;
		thinker->bStretchY = false;
	}
	thinker->bStarted = false;
	return thinker;
}